

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

put_transaction<density_tests::TestObject<128UL,_8UL>_> * __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
::start_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
          (put_transaction<density_tests::TestObject<128UL,_8UL>_> *__return_storage_ptr__,
          sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
          *this,TestObject<128UL,_8UL> *i_construction_params)

{
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  *pTVar1;
  put_transaction<density_tests::TestObject<128UL,_8UL>_> local_78;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  *local_48;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  *type_storage;
  runtime_type *type;
  Allocation push_data;
  TestObject<128UL,_8UL> *i_construction_params_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  detail::
  SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,density::default_busy_wait>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,128ul,8ul>
            ((Allocation *)&type,this);
  type_storage = (TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
                  *)0x0;
  pTVar1 = detail::
           LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_density::default_busy_wait>_>
           ::type_after_control((ControlBlock *)type);
  local_48 = pTVar1;
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
  ::make<density_tests::TestObject<128ul,8ul>>();
  type_storage = pTVar1;
  density_tests::TestObject<128UL,_8UL>::TestObject
            ((TestObject<128UL,_8UL> *)push_data.m_next_ptr,
             (TestObject<128UL,_8UL> *)push_data.m_user_storage);
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<density_tests::TestObject<128UL,_8UL>_>::put_transaction
            (&local_78,0,
             (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
              *)this,(Allocation *)&type);
  put_transaction<density_tests::TestObject<128ul,8ul>>::
  put_transaction<density_tests::TestObject<128ul,8ul>,void>
            ((put_transaction<density_tests::TestObject<128ul,8ul>> *)__return_storage_ptr__,
             &local_78);
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<density_tests::TestObject<128UL,_8UL>_>::~put_transaction(&local_78);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }